

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O1

WW<68UL> * __thiscall GF2::WW<68UL>::Reverse(WW<68UL> *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  word wVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar4 = 1;
  uVar3 = 0x43;
  do {
    uVar1 = uVar4 - 1;
    uVar2 = this->_words[uVar1 >> 6];
    uVar5 = uVar3 >> 6;
    uVar6 = 1L << ((byte)uVar3 & 0x3f);
    uVar8 = uVar2 | 1L << (uVar1 & 0x3f);
    if ((this->_words[uVar5] >> (uVar3 & 0x3f) & 1) == 0) {
      uVar8 = uVar2 & ~(1L << (uVar1 & 0x3f));
    }
    this->_words[uVar1 >> 6] = uVar8;
    if ((uVar2 >> (uVar1 & 0x3f) & 1) == 0) {
      wVar7 = ~uVar6 & this->_words[uVar5];
    }
    else {
      wVar7 = uVar6 | this->_words[uVar5];
    }
    this->_words[uVar5] = wVar7;
    uVar4 = uVar4 + 1;
    bVar9 = uVar4 < uVar3;
    uVar3 = uVar3 - 1;
  } while (bVar9);
  return this;
}

Assistant:

WW& Reverse()
	{	
		for (size_t start = 0, end = _n; start + 1 < end; ++start, --end)
		{
			bool save = Test(start);
			Set(start, Test(end - 1));
			Set(end - 1, save);
		}
		return *this;
	}